

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ioWriteBaf.c
# Opt level: O1

void Io_WriteBaf(Abc_Ntk_t *pNtk,char *pFileName)

{
  uint uVar1;
  Abc_Obj_t *pObj;
  undefined8 *puVar2;
  long *plVar3;
  int *piVar4;
  bool bVar5;
  int iVar6;
  int iVar7;
  FILE *__stream;
  char *pcVar8;
  char *pcVar9;
  ulong uVar10;
  ulong uVar11;
  void *__ptr;
  ProgressBar *p;
  Vec_Ptr_t *pVVar12;
  long lVar13;
  size_t __size;
  long lVar14;
  long lVar15;
  int nItemsCur;
  
  if (pNtk->ntkType != ABC_NTK_STRASH) {
    __assert_fail("Abc_NtkIsStrash(pNtk)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/io/ioWriteBaf.c"
                  ,0x5b,"void Io_WriteBaf(Abc_Ntk_t *, char *)");
  }
  __stream = fopen(pFileName,"wb");
  if (__stream == (FILE *)0x0) {
    fprintf(_stdout,"Io_WriteBaf(): Cannot open the output file \"%s\".\n",pFileName);
    return;
  }
  pcVar9 = pNtk->pName;
  pcVar8 = Extra_TimeStamp();
  fprintf(__stream,"# BAF (Binary Aig Format) for \"%s\" written by ABC on %s\n",pcVar9,pcVar8);
  fprintf(__stream,"%s%c",pNtk->pName,0);
  fprintf(__stream,"%d%c",(ulong)(uint)pNtk->vPis->nSize,0);
  fprintf(__stream,"%d%c",(ulong)(uint)pNtk->vPos->nSize,0);
  fprintf(__stream,"%d%c",(ulong)(uint)pNtk->nObjCounts[8],0);
  fprintf(__stream,"%d%c",(ulong)(uint)pNtk->nObjCounts[7],0);
  pVVar12 = pNtk->vPis;
  if (0 < pVVar12->nSize) {
    lVar13 = 0;
    do {
      pcVar9 = Abc_ObjName((Abc_Obj_t *)pVVar12->pArray[lVar13]);
      fprintf(__stream,"%s%c",pcVar9,0);
      lVar13 = lVar13 + 1;
      pVVar12 = pNtk->vPis;
    } while (lVar13 < pVVar12->nSize);
  }
  pVVar12 = pNtk->vPos;
  if (0 < pVVar12->nSize) {
    lVar13 = 0;
    do {
      pcVar9 = Abc_ObjName((Abc_Obj_t *)pVVar12->pArray[lVar13]);
      fprintf(__stream,"%s%c",pcVar9,0);
      lVar13 = lVar13 + 1;
      pVVar12 = pNtk->vPos;
    } while (lVar13 < pVVar12->nSize);
  }
  pVVar12 = pNtk->vBoxes;
  if (0 < pVVar12->nSize) {
    lVar13 = 0;
    do {
      pObj = (Abc_Obj_t *)pVVar12->pArray[lVar13];
      if ((*(uint *)&pObj->field_0x14 & 0xf) == 8) {
        pcVar9 = Abc_ObjName(pObj);
        fprintf(__stream,"%s%c",pcVar9,0);
        pcVar9 = Abc_ObjName((Abc_Obj_t *)pObj->pNtk->vObjs->pArray[*(pObj->vFanins).pArray]);
        fprintf(__stream,"%s%c",pcVar9,0);
        pcVar9 = Abc_ObjName((Abc_Obj_t *)pObj->pNtk->vObjs->pArray[*(pObj->vFanouts).pArray]);
        fprintf(__stream,"%s%c",pcVar9,0);
      }
      lVar13 = lVar13 + 1;
      pVVar12 = pNtk->vBoxes;
    } while (lVar13 < pVVar12->nSize);
  }
  Abc_NtkCleanCopy(pNtk);
  pVVar12 = pNtk->vCis;
  if (pVVar12->nSize < 1) {
    uVar11 = 1;
  }
  else {
    uVar10 = 1;
    do {
      *(ulong *)((long)pVVar12->pArray[uVar10 - 1] + 0x40) = uVar10;
      uVar11 = uVar10 + 1;
      pVVar12 = pNtk->vCis;
      bVar5 = (long)uVar10 < (long)pVVar12->nSize;
      uVar10 = uVar11;
    } while (bVar5);
  }
  pVVar12 = pNtk->vObjs;
  if (0 < pVVar12->nSize) {
    lVar13 = 0;
    do {
      puVar2 = (undefined8 *)pVVar12->pArray[lVar13];
      if (puVar2 != (undefined8 *)0x0) {
        if (((ulong)puVar2 & 1) != 0) goto LAB_00339bd5;
        if (*(int *)*puVar2 != 3) goto LAB_00339bcc;
        if (*(int *)((long)puVar2 + 0x1c) == 2) {
          iVar6 = (int)uVar11;
          uVar11 = (ulong)(iVar6 + 1);
          puVar2[8] = (long)iVar6;
        }
      }
      lVar13 = lVar13 + 1;
      pVVar12 = pNtk->vObjs;
    } while (lVar13 < pVVar12->nSize);
  }
  lVar13 = (long)pNtk->vCos->nSize + (long)pNtk->nObjCounts[7] * 2;
  __size = lVar13 * 4;
  __ptr = malloc(__size);
  iVar6 = (int)lVar13;
  p = Extra_ProgressBarStart((FILE *)_stdout,iVar6);
  pVVar12 = pNtk->vObjs;
  if (pVVar12->nSize < 1) {
    nItemsCur = 0;
  }
  else {
    lVar13 = 0;
    nItemsCur = 0;
    do {
      plVar3 = (long *)pVVar12->pArray[lVar13];
      if (plVar3 != (long *)0x0) {
        if (((ulong)plVar3 & 1) != 0) goto LAB_00339bd5;
        if (*(int *)*plVar3 != 3) goto LAB_00339bcc;
        if (*(int *)((long)plVar3 + 0x1c) == 2) {
          if ((p == (ProgressBar *)0x0) || (p->nItemsNext <= nItemsCur)) {
            Extra_ProgressBarUpdate_int(p,nItemsCur,(char *)0x0);
          }
          lVar15 = *(long *)(*(long *)(*plVar3 + 0x20) + 8);
          piVar4 = (int *)plVar3[4];
          uVar1 = *(uint *)((long)plVar3 + 0x14);
          lVar14 = (long)nItemsCur;
          *(uint *)((long)__ptr + lVar14 * 4) =
               (uVar1 >> 10 & 1) + *(int *)(*(long *)(lVar15 + (long)*piVar4 * 8) + 0x40) * 2;
          nItemsCur = nItemsCur + 2;
          *(uint *)((long)__ptr + lVar14 * 4 + 4) =
               (uVar1 >> 0xb & 1) + *(int *)(*(long *)(lVar15 + (long)piVar4[1] * 8) + 0x40) * 2;
        }
      }
      lVar13 = lVar13 + 1;
      pVVar12 = pNtk->vObjs;
    } while (lVar13 < pVVar12->nSize);
  }
  pVVar12 = pNtk->vCos;
  if (0 < pVVar12->nSize) {
    lVar13 = (long)nItemsCur;
    lVar15 = 0;
    do {
      plVar3 = (long *)pVVar12->pArray[lVar15];
      if ((p == (ProgressBar *)0x0) || ((long)p->nItemsNext <= lVar13 + lVar15)) {
        Extra_ProgressBarUpdate_int(p,nItemsCur + (int)lVar15,(char *)0x0);
      }
      lVar14 = *(long *)(*(long *)(*plVar3 + 0x20) + 8);
      iVar7 = (*(uint *)((long)plVar3 + 0x14) >> 10 & 1) +
              *(int *)(*(long *)(lVar14 + (long)*(int *)plVar3[4] * 8) + 0x40) * 2;
      *(int *)((long)__ptr + lVar15 * 4 + lVar13 * 4) = iVar7;
      if ((0 < *(int *)((long)plVar3 + 0x2c)) &&
         (lVar14 = *(long *)(lVar14 + (long)*(int *)plVar3[6] * 8),
         (*(uint *)(lVar14 + 0x14) & 0xf) == 8)) {
        *(uint *)((long)__ptr + lVar15 * 4 + lVar13 * 4) =
             (*(uint *)(lVar14 + 0x38) & 3) + iVar7 * 4;
      }
      lVar15 = lVar15 + 1;
      pVVar12 = pNtk->vCos;
    } while (lVar15 < pVVar12->nSize);
    nItemsCur = nItemsCur + (int)lVar15;
  }
  Extra_ProgressBarStop(p);
  if (iVar6 != nItemsCur) {
    __assert_fail("nBufferSize == nAnds",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/io/ioWriteBaf.c"
                  ,0x9e,"void Io_WriteBaf(Abc_Ntk_t *, char *)");
  }
  fwrite(__ptr,1,__size,__stream);
  fclose(__stream);
  if (__ptr == (void *)0x0) {
    return;
  }
  free(__ptr);
  return;
LAB_00339bd5:
  pcVar9 = "!Abc_ObjIsComplement(pNode)";
  goto LAB_00339bdc;
LAB_00339bcc:
  pcVar9 = "Abc_NtkIsStrash(pNode->pNtk)";
LAB_00339bdc:
  __assert_fail(pcVar9,
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abc.h"
                ,399,"int Abc_AigNodeIsAnd(Abc_Obj_t *)");
}

Assistant:

ABC_NAMESPACE_IMPL_START


////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

/*
    Binary Aig Format

    The motivation for this format is to have
    - compact binary representation of large AIGs (~10x more compact than BLIF)
    - consequently, fast reading/writing of large AIGs (~10x faster than BLIF)
    - representation for all tech-ind info related to an AIG
    - human-readable file header

    The header:
    (1) May contain several lines of human-readable comments.
        Each comment line begins with symbol '#' and ends with symbol '\n'.
    (2) Always contains the following data. 
        - benchmark name
        - number of primary inputs
        - number of primary outputs
        - number of latches
        - number of AIG nodes (excluding the constant 1 node)
        Each entry is followed by 0-byte (character '\0'):
    (3) Next follow the names of the PIs, POs, and latches in this order. 
        Each name is followed by 0-byte (character '\0').
        Inside each set of names (PIs, POs, latches) there should be no
        identical names but the PO names may coincide with PI/latch names.

    The body:
    (1) First part of the body contains binary information about the internal AIG nodes.
        Each internal AIG node is represented using two edges (each edge is a 4-byte integer). 
        Each integer is the fanin ID followed by 1-bit representation of the complemented attribute.
        (For example, complemented edge to node 10 will be represented as 2*10 + 1 = 21.)
        The IDs of the nodes are created as follows: Constant 1 node has ID=0. 
        CIs (PIs and latch outputs) have 1-based IDs assigned in that order.
        Each node in the array of the internal AIG nodes has the ID assigned in that order.
        The constant 1 node is not written into the file.
    (2) Second part of the body contains binary information about the edges connecting 
        the COs (POs and latch inputs) to the internal AIG nodes.
        Each edge is a 4-byte integer the same way as a node fanin.
        The latch initial value (2 bits) is stored in this integer.
*/

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    [Writes the AIG in the binary format.]

  Description []
  
  SideEffects []

  SeeAlso     []

***********************************************************************/
void Io_WriteBaf( Abc_Ntk_t * pNtk, char * pFileName )
{
    ProgressBar * pProgress;
    FILE * pFile;
    Abc_Obj_t * pObj;
    int i, nNodes, nAnds, nBufferSize;
    unsigned * pBufferNode;
    assert( Abc_NtkIsStrash(pNtk) );
    // start the output stream
    pFile = fopen( pFileName, "wb" );
    if ( pFile == NULL )
    {
        fprintf( stdout, "Io_WriteBaf(): Cannot open the output file \"%s\".\n", pFileName );
        return;
    }

    // write the comment
    fprintf( pFile, "# BAF (Binary Aig Format) for \"%s\" written by ABC on %s\n", pNtk->pName, Extra_TimeStamp() );

    // write the network name
    fprintf( pFile, "%s%c", pNtk->pName, 0 );
    // write the number of PIs
    fprintf( pFile, "%d%c", Abc_NtkPiNum(pNtk), 0 );
    // write the number of POs
    fprintf( pFile, "%d%c", Abc_NtkPoNum(pNtk), 0 );
    // write the number of latches
    fprintf( pFile, "%d%c", Abc_NtkLatchNum(pNtk), 0 );
    // write the number of internal nodes
    fprintf( pFile, "%d%c", Abc_NtkNodeNum(pNtk), 0 );

    // write PIs
    Abc_NtkForEachPi( pNtk, pObj, i )
        fprintf( pFile, "%s%c", Abc_ObjName(pObj), 0 );
    // write POs
    Abc_NtkForEachPo( pNtk, pObj, i )
        fprintf( pFile, "%s%c", Abc_ObjName(pObj), 0 );
    // write latches
    Abc_NtkForEachLatch( pNtk, pObj, i )
    {
        fprintf( pFile, "%s%c", Abc_ObjName(pObj), 0 );
        fprintf( pFile, "%s%c", Abc_ObjName(Abc_ObjFanin0(pObj)), 0 );
        fprintf( pFile, "%s%c", Abc_ObjName(Abc_ObjFanout0(pObj)), 0 );
    }

    // set the node numbers to be used in the output file
    Abc_NtkCleanCopy( pNtk );
    nNodes = 1;
    Abc_NtkForEachCi( pNtk, pObj, i )
        pObj->pCopy = (Abc_Obj_t *)(ABC_PTRINT_T)nNodes++;
    Abc_AigForEachAnd( pNtk, pObj, i )
        pObj->pCopy = (Abc_Obj_t *)(ABC_PTRINT_T)nNodes++;

    // write the nodes into the buffer
    nAnds = 0;
    nBufferSize = Abc_NtkNodeNum(pNtk) * 2 + Abc_NtkCoNum(pNtk);
    pBufferNode = ABC_ALLOC( unsigned, nBufferSize );
    pProgress = Extra_ProgressBarStart( stdout, nBufferSize );
    Abc_AigForEachAnd( pNtk, pObj, i )
    {
        Extra_ProgressBarUpdate( pProgress, nAnds, NULL );
        pBufferNode[nAnds++] = (((int)(ABC_PTRINT_T)Abc_ObjFanin0(pObj)->pCopy) << 1) | (int)Abc_ObjFaninC0(pObj);
        pBufferNode[nAnds++] = (((int)(ABC_PTRINT_T)Abc_ObjFanin1(pObj)->pCopy) << 1) | (int)Abc_ObjFaninC1(pObj);
    }

    // write the COs into the buffer
    Abc_NtkForEachCo( pNtk, pObj, i )
    {
        Extra_ProgressBarUpdate( pProgress, nAnds, NULL );
        pBufferNode[nAnds] = (((int)(ABC_PTRINT_T)Abc_ObjFanin0(pObj)->pCopy) << 1) | (int)Abc_ObjFaninC0(pObj);
        if ( Abc_ObjFanoutNum(pObj) > 0 && Abc_ObjIsLatch(Abc_ObjFanout0(pObj)) )
            pBufferNode[nAnds] = (pBufferNode[nAnds] << 2) | ((int)(ABC_PTRINT_T)Abc_ObjData(Abc_ObjFanout0(pObj)) & 3);
        nAnds++;
    }
    Extra_ProgressBarStop( pProgress );
    assert( nBufferSize == nAnds );

    // write the buffer
    fwrite( pBufferNode, 1, sizeof(int) * nBufferSize, pFile );
    fclose( pFile );
    ABC_FREE( pBufferNode );
}